

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_fill_extcomplex_module
              (ly_ctx *ctx,lys_ext_instance_complex *ext,char *parent_name,char **values,
              int implemented)

{
  LY_ERR *pLVar1;
  lys_module *plVar2;
  lyext_substmt *local_68;
  lyext_substmt *info;
  lys_module **pp;
  lys_module *reallocated;
  lys_module ***p;
  lys_module **modules;
  int local_38;
  int i;
  int c;
  int implemented_local;
  char **values_local;
  char *parent_name_local;
  lys_ext_instance_complex *ext_local;
  ly_ctx *ctx_local;
  
  if (values == (char **)0x0) {
    ctx_local._4_4_ = 0;
  }
  else {
    i = implemented;
    _c = values;
    values_local = (char **)parent_name;
    parent_name_local = (char *)ext;
    ext_local = (lys_ext_instance_complex *)ctx;
    info = (lyext_substmt *)lys_ext_complex_get_substmt(LY_STMT_MODULE,ext,&local_68);
    p = (lys_module ***)info;
    if (info == (lyext_substmt *)0x0) {
      ly_vlog(LYE_INCHILDSTMT,LY_VLOG_NONE,(void *)0x0,"module",values_local);
      ctx_local._4_4_ = 1;
    }
    else {
      for (modules._4_4_ = 0; _c[modules._4_4_] != (char *)0x0; modules._4_4_ = modules._4_4_ + 1) {
        local_38 = 0;
        if ((local_68->cardinality < LY_STMT_CARD_SOME) && (*p != (lys_module **)0x0)) {
          ly_vlog(LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,"module",values_local);
          return 1;
        }
        if (LY_STMT_CARD_MAND < local_68->cardinality) {
          reallocated = (lys_module *)info;
          p = *(lys_module ****)info;
          if (p == (lys_module ***)0x0) {
            p = (lys_module ***)calloc(2,8);
            reallocated->ctx = (ly_ctx *)p;
          }
          else {
            local_38 = 0;
            for (; *p != (lys_module **)0x0; p = p + 1) {
              local_38 = local_38 + 1;
            }
          }
        }
        if (local_38 != 0) {
          pp = (lys_module **)realloc(reallocated->ctx,(long)(local_38 + 2) << 3);
          if ((ly_ctx *)pp == (ly_ctx *)0x0) {
            pLVar1 = ly_errno_location();
            *pLVar1 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_fill_extcomplex_module");
            return 1;
          }
          reallocated->ctx = (ly_ctx *)pp;
          p = (lys_module ***)reallocated->ctx;
          (&(((ly_ctx *)p)->dict).recs[0].next)[local_38 + 1] = (dict_rec *)0x0;
        }
        plVar2 = yang_read_module((ly_ctx *)ext_local,_c[modules._4_4_],0,(char *)0x0,i);
        p[local_38] = (lys_module **)plVar2;
        if (p[local_38] == (lys_module **)0x0) {
          return 1;
        }
      }
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int
yang_fill_extcomplex_module(struct ly_ctx *ctx, struct lys_ext_instance_complex *ext,
                            char *parent_name, char **values, int implemented)
{
    int c, i;
    struct lys_module **modules, ***p, *reallocated, **pp;
    struct lyext_substmt *info;

    if (!values) {
        return EXIT_SUCCESS;
    }
    pp = modules = lys_ext_complex_get_substmt(LY_STMT_MODULE, ext, &info);
    if (!modules) {
        LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, "module", parent_name);
        return EXIT_FAILURE;
    }

    for (i = 0; values[i]; ++i) {
        c = 0;
        if (info->cardinality < LY_STMT_CARD_SOME && *modules) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, "module", parent_name);
            return EXIT_FAILURE;
        }
        if (info->cardinality >= LY_STMT_CARD_SOME) {
            /* there can be multiple instances, so instead of pointer to array,
             * we have in modules pointer to pointer to array */
            p = (struct lys_module ***)pp;
            modules = *p;
            if (!modules) {
                /* allocate initial array */
                *p = modules = calloc(2, sizeof(struct lys_module *));
            } else {
                for (c = 0; *modules; modules++, c++);
            }
        }

        if (c) {
            /* enlarge the array */
            reallocated = realloc(*p, (c + 2) * sizeof(struct lys_module *));
            if (!reallocated) {
                LOGMEM;
                return EXIT_FAILURE;
            }
            *p = (struct lys_module **)reallocated;
            modules = *p;
            modules[c + 1] = NULL;
        }

        modules[c] = yang_read_module(ctx, values[i], 0, NULL, implemented);
        if (!modules[c]) {
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;
}